

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void normalize_color_encoding(color_encoding *encoding)

{
  double dVar1;
  double whiteY;
  color_encoding *encoding_local;
  
  dVar1 = (encoding->red).Y + (encoding->green).Y + (encoding->blue).Y;
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    (encoding->red).X = (encoding->red).X / dVar1;
    (encoding->red).Y = (encoding->red).Y / dVar1;
    (encoding->red).Z = (encoding->red).Z / dVar1;
    (encoding->green).X = (encoding->green).X / dVar1;
    (encoding->green).Y = (encoding->green).Y / dVar1;
    (encoding->green).Z = (encoding->green).Z / dVar1;
    (encoding->blue).X = (encoding->blue).X / dVar1;
    (encoding->blue).Y = (encoding->blue).Y / dVar1;
    (encoding->blue).Z = (encoding->blue).Z / dVar1;
  }
  return;
}

Assistant:

static void
normalize_color_encoding(color_encoding *encoding)
{
   const double whiteY = encoding->red.Y + encoding->green.Y +
      encoding->blue.Y;

   if (whiteY != 1)
   {
      encoding->red.X /= whiteY;
      encoding->red.Y /= whiteY;
      encoding->red.Z /= whiteY;
      encoding->green.X /= whiteY;
      encoding->green.Y /= whiteY;
      encoding->green.Z /= whiteY;
      encoding->blue.X /= whiteY;
      encoding->blue.Y /= whiteY;
      encoding->blue.Z /= whiteY;
   }
}